

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX.cpp
# Opt level: O2

void amrex::Error_host(char *msg)

{
  runtime_error *this;
  
  if (system::error_handler != (code *)0x0) {
    (*system::error_handler)(msg);
    return;
  }
  if (system::throw_exception == 0) {
    anon_unknown.dwarf_6e2d06::write_lib_id("Error");
    write_to_stderr_without_buffering(msg);
    ParallelDescriptor::Abort(6,true);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,msg);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
amrex::Error_host (const char * msg)
{
    if (system::error_handler) {
        system::error_handler(msg);
    } else if (system::throw_exception) {
        throw RuntimeError(msg);
    } else {
        write_lib_id("Error");
        write_to_stderr_without_buffering(msg);
#ifdef AMREX_USE_OMP
#pragma omp critical (amrex_abort_omp_critical)
#endif
        ParallelDescriptor::Abort();
    }
}